

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_trainFromBuffer_legacy
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_legacy_params_t params)

{
  short sVar1;
  U32 UVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  U32 UVar6;
  ZDICT_legacy_params_t ZVar7;
  byte bVar8;
  uint acc;
  uint uVar9;
  uint uVar10;
  int iVar11;
  U32 UVar12;
  int iVar13;
  uint uVar14;
  U32 UVar15;
  uint uVar16;
  size_t sVar17;
  uchar *T;
  dictItem *table;
  int *__ptr;
  void *pvVar18;
  void *__s;
  undefined8 uVar19;
  ulong uVar20;
  size_t sVar21;
  clock_t cVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  U32 *pUVar27;
  uint uVar28;
  uint uVar29;
  dictItem *pdVar30;
  uchar uVar31;
  BYTE *b;
  uchar *puVar32;
  U32 idx;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  size_t sVar36;
  dictItem *pdVar37;
  ulong uVar38;
  int *SA;
  bool bVar39;
  dictItem elt;
  dictItem elt_00;
  undefined4 uVar40;
  uint local_3e0;
  long local_388;
  ZDICT_params_t local_338 [21];
  undefined4 local_23c;
  uint local_238 [5];
  undefined4 local_224;
  uint local_138 [63];
  undefined4 local_3c;
  
  ZVar7 = params;
  sVar17 = ZDICT_totalSampleSize(samplesSizes,nbSamples);
  if (sVar17 < 0x200) {
    return 0;
  }
  T = (uchar *)malloc(sVar17 + 0x20);
  if (T == (uchar *)0x0) {
    return 0xffffffffffffffc0;
  }
  memcpy(T,samplesBuffer,sVar17);
  uVar9 = 0x9e3779b1;
  for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 1) {
    uVar9 = uVar9 * -0x7a143589;
    T[lVar25 + sVar17] = (uchar)(uVar9 >> 0x15);
  }
  uVar9 = (uint)(dictBufferCapacity >> 4);
  if (uVar9 < nbSamples) {
    uVar9 = nbSamples;
  }
  uVar26 = 10000;
  if (10000 < uVar9) {
    uVar26 = (ulong)uVar9;
  }
  table = (dictItem *)malloc(uVar26 * 0xc);
  uVar9 = 9;
  if (params.selectivityLevel != 0) {
    uVar9 = params.selectivityLevel;
  }
  uVar28 = nbSamples >> ((byte)uVar9 & 0x1f);
  if (0x1e < uVar9) {
    uVar28 = 4;
  }
  sVar17 = ZDICT_totalSampleSize(samplesSizes,nbSamples);
  if (table == (dictItem *)0x0) {
    uVar40 = 0xffffffc0;
  }
  else if (dictBufferCapacity < 0x100) {
    free(table);
    uVar40 = 0xffffffba;
  }
  else {
    if (0x1ff < sVar17) {
      table->pos = 1;
      table->length = 0;
      table->savings = 0xffffffff;
      __ptr = (int *)malloc(sVar17 * 4 + 8);
      pvVar18 = malloc(sVar17 * 4);
      __s = malloc(sVar17 + 0x10);
      auVar5._8_8_ = 0;
      auVar5._0_4_ = params.zParams.compressionLevel;
      auVar5._4_4_ = params.zParams.notificationLevel;
      uVar19 = extractps(auVar5,1);
      uVar10 = (uint)uVar19;
      if (1 < uVar10) {
        fprintf(_stderr,"\r%70s\r","");
        fflush(_stderr);
      }
      if (__s != (void *)0x0 && (pvVar18 != (void *)0x0 && __ptr != (int *)0x0)) {
        uVar38 = 4;
        if (4 < uVar28) {
          uVar38 = (ulong)uVar28;
        }
        uVar23 = (uint)uVar38;
        uVar20 = uVar38;
        memset(__s,0,sVar17 + 0x10);
        iVar11 = (int)CONCAT71((int7)(uVar20 >> 8),uVar10 < 3 || sVar17 < 0x7d000001);
        if (uVar10 >= 3 && sVar17 >= 0x7d000001) {
          fprintf(_stderr,"sample set too large : reduced to %u MB ...\n",2000);
          fflush(_stderr);
        }
        SA = __ptr + 1;
        uVar20 = (ulong)nbSamples;
        for (sVar36 = sVar17; 0x7d000000 < sVar36; sVar36 = sVar36 - samplesSizes[uVar20]) {
          uVar20 = (ulong)((int)uVar20 - 1);
        }
        if (1 < uVar10) {
          iVar11 = (int)(sVar36 >> 0x14);
          fprintf(_stderr,"sorting %u files of total size %u MB ...\n");
          fflush(_stderr);
        }
        iVar13 = (int)sVar36;
        iVar11 = divsufsort(T,SA,iVar13,iVar11);
        if (iVar11 == 0) {
          __ptr[sVar36 + 1] = iVar13;
          *__ptr = iVar13;
          for (uVar20 = 0; sVar36 != uVar20; uVar20 = uVar20 + 1) {
            *(int *)((long)pvVar18 + (long)SA[uVar20] * 4) = (int)uVar20;
          }
          if (1 < uVar10) {
            fwrite("finding patterns ... \n",0x16,1,_stderr);
            fflush(_stderr);
            if (2 < uVar10) {
              fprintf(_stderr,"minimum ratio : %u \n",uVar38);
              fflush(_stderr);
            }
          }
          uVar38 = 0;
          local_388 = 0;
          while (uVar38 < sVar36) {
            iVar11 = (int)uVar38;
            if (*(char *)((long)__s + uVar38) == '\0') {
              uVar24 = *(uint *)((long)pvVar18 + uVar38 * 4);
              memset(local_238,0,0x100);
              lVar25 = (long)SA[uVar24];
              *(undefined1 *)((long)__s + lVar25) = 1;
              puVar32 = T + lVar25;
              if (((*(short *)(T + lVar25) == *(short *)(T + lVar25 + 2)) ||
                  (*(short *)(puVar32 + 1) == *(short *)(puVar32 + 3))) ||
                 (*(short *)(T + lVar25 + 2) == *(short *)(puVar32 + 4))) {
                uVar38 = 4;
                do {
                  uVar24 = (int)uVar38 + 2;
                  uVar38 = (ulong)uVar24;
                  sVar1 = *(short *)(puVar32 + uVar38);
                } while (sVar1 == *(short *)(puVar32 + 4));
                uVar31 = puVar32[uVar38 - 1];
                for (uVar38 = 1; uVar38 < (uVar31 == (uchar)sVar1) + uVar24; uVar38 = uVar38 + 1) {
                  *(undefined1 *)((long)__s + uVar38 + lVar25) = 1;
                }
LAB_001b2a45:
                uVar38 = (ulong)(iVar11 + 1);
              }
              else {
                uVar38 = (ulong)uVar24;
                uVar16 = 0;
                do {
                  uVar35 = uVar16;
                  uVar38 = (ulong)((int)uVar38 + 1);
                  sVar21 = ZDICT_count(puVar32,T + SA[uVar38]);
                  uVar20 = (ulong)uVar24;
                  uVar16 = uVar35 + 1;
                } while (6 < sVar21);
                do {
                  uVar33 = uVar20;
                  uVar24 = (uint)uVar33;
                  sVar21 = ZDICT_count(puVar32,T + __ptr[uVar33]);
                  uVar35 = uVar35 + 1;
                  uVar20 = (ulong)(uVar24 - 1);
                } while (6 < sVar21);
                if (uVar35 < uVar23) {
                  for (; uVar33 < uVar38; uVar33 = uVar33 + 1) {
                    *(undefined1 *)((long)__s + (long)SA[uVar33]) = 1;
                  }
                  goto LAB_001b2a45;
                }
                if (3 < uVar10) {
                  fputc(10,_stderr);
                  fflush(_stderr);
                  fprintf(_stderr,"found %3u matches of length >= %i at pos %7u  ",(ulong)uVar35,7);
                  fflush(_stderr);
                  fputc(10,_stderr);
                  fflush(_stderr);
                }
                iVar13 = 7;
                while( true ) {
                  uVar31 = '\0';
                  uVar35 = 0;
                  uVar34 = (ulong)uVar24;
                  uVar16 = 0;
                  uVar20 = (ulong)uVar24;
                  for (uVar33 = (ulong)uVar24; uVar33 < uVar38; uVar33 = uVar33 + 1) {
                    if (T[(uint)(SA[uVar33] + iVar13)] != uVar31) {
                      if (uVar16 < uVar35) {
                        uVar20 = uVar34;
                        uVar16 = uVar35;
                      }
                      uVar35 = 0;
                      uVar34 = uVar33 & 0xffffffff;
                      uVar31 = T[(uint)(SA[uVar33] + iVar13)];
                    }
                    uVar35 = uVar35 + 1;
                  }
                  uVar29 = uVar16;
                  if (uVar16 < uVar35) {
                    uVar29 = uVar35;
                  }
                  if (uVar29 < uVar23) break;
                  uVar24 = (uint)uVar20;
                  if (uVar16 < uVar35) {
                    uVar24 = (uint)uVar34;
                  }
                  uVar38 = (ulong)(uVar29 + uVar24);
                  iVar13 = iVar13 + 1;
                }
                iVar13 = SA[uVar24];
                uVar38 = (ulong)iVar13;
                memset(local_338,0,0x100);
                puVar32 = T + uVar38;
                uVar16 = uVar24;
                do {
                  uVar16 = uVar16 + 1;
                  sVar21 = ZDICT_count(puVar32,T + SA[uVar16]);
                  uVar35 = (uint)sVar21;
                  if (0x3e < sVar21) {
                    uVar35 = 0x3f;
                  }
                  (&local_338[0].compressionLevel)[uVar35] =
                       (&local_338[0].compressionLevel)[uVar35] + 1;
                } while (6 < sVar21);
                uVar20 = 7;
                while ((uVar35 = uVar24, 6 < uVar20 && (uVar35 != 0))) {
                  sVar21 = ZDICT_count(puVar32,T + SA[uVar35 - 1]);
                  uVar20 = sVar21;
                  if (0x3e < sVar21) {
                    uVar20 = 0x3f;
                  }
                  (&local_338[0].compressionLevel)[uVar20 & 0xffffffff] =
                       (&local_338[0].compressionLevel)[uVar20 & 0xffffffff] + 1;
                  uVar24 = uVar35 - 1;
                  if (sVar21 < 7) {
                    uVar24 = uVar35;
                  }
                }
                memset(local_138,0,0x100);
                local_3c = local_23c;
                uVar20 = 0x3f;
                while (uVar33 = uVar20 - 1, -1 < (int)uVar33) {
                  local_138[uVar33 & 0xffffffff] =
                       (&local_338[0].compressionLevel)[uVar33 & 0xffffffff] + local_138[uVar20];
                  uVar20 = uVar33;
                }
                uVar20 = 0x40;
                for (uVar24 = 0x3f; 6 < uVar24; uVar24 = uVar24 - 1) {
                  if (uVar23 <= local_138[uVar24]) goto LAB_001b2a30;
                  uVar20 = (ulong)((int)uVar20 - 1);
                }
                uVar24 = 6;
LAB_001b2a30:
                do {
                  uVar29 = (int)uVar20 - 1;
                  uVar20 = (ulong)uVar29;
                } while (puVar32[uVar20 - 2] == puVar32[(long)(int)uVar24 + -1]);
                if (uVar29 < 7) goto LAB_001b2a45;
                local_224 = 0;
                for (lVar25 = 7; lVar25 <= (int)uVar29; lVar25 = lVar25 + 1) {
                  local_238[lVar25] =
                       ((int)lVar25 + -3) * (&local_338[0].compressionLevel)[lVar25] +
                       local_238[lVar25 + -1];
                }
                if (uVar10 < 4) {
                  uVar24 = local_238[uVar20];
                }
                else {
                  uVar24 = local_238[uVar20];
                  fprintf(_stderr,
                          "Selected dict at position %u, of length %u : saves %u (ratio: %.2f)  \n",
                          SUB84((double)uVar24 / (double)uVar20,0),uVar38);
                  fflush(_stderr);
                }
                for (uVar20 = (ulong)uVar35; uVar20 < uVar16; uVar20 = uVar20 + 1) {
                  uVar35 = SA[uVar20];
                  uVar33 = (ulong)uVar35;
                  uVar14 = uVar29;
                  if (uVar33 != uVar38) {
                    sVar21 = ZDICT_count(puVar32,T + uVar33);
                    uVar14 = (uint)sVar21;
                    if (uVar29 < (uint)sVar21) {
                      uVar14 = uVar29;
                    }
                  }
                  for (; uVar33 < uVar14 + uVar35; uVar33 = uVar33 + 1) {
                    *(undefined1 *)((long)__s + uVar33) = 1;
                  }
                }
                elt.savings = uVar24;
                elt.pos = iVar13;
                elt.length = uVar29;
                UVar12 = ZDICT_tryMerge(table,elt,0,T);
                if (UVar12 == 0) {
                  uVar16 = table->pos;
                  if ((uint)uVar26 <= table->pos) {
                    uVar16 = (uint)uVar26 - 1;
                  }
                  uVar38 = (ulong)uVar16;
                  while( true ) {
                    uVar20 = (ulong)((int)uVar38 - 1);
                    pdVar37 = table + uVar38;
                    if (uVar24 <= table[uVar20].savings) break;
                    pdVar30 = table + uVar20;
                    pdVar37->savings = pdVar30->savings;
                    UVar12 = pdVar30->length;
                    pdVar37->pos = pdVar30->pos;
                    pdVar37->length = UVar12;
                    uVar38 = uVar20;
                  }
                  pdVar37->pos = iVar13;
                  pdVar37->length = uVar29;
                  pdVar37->savings = uVar24;
                  table->pos = uVar16 + 1;
                }
                else {
                  UVar15 = 1;
                  while (UVar15 != 0) {
                    uVar38 = (ulong)UVar12;
                    uVar3 = table[uVar38].pos;
                    uVar4 = table[uVar38].length;
                    elt_00.length = uVar4;
                    elt_00.pos = uVar3;
                    elt_00.savings = table[uVar38].savings;
                    UVar15 = ZDICT_tryMerge(table,elt_00,UVar12,T);
                    bVar39 = UVar12 != 0;
                    UVar12 = UVar15;
                    if ((bVar39) && (UVar15 != 0)) {
                      UVar2 = table->pos;
                      pdVar37 = table + uVar38;
                      for (; uVar38 < UVar2 - 1; uVar38 = uVar38 + 1) {
                        pdVar37->savings = pdVar37[1].savings;
                        UVar6 = pdVar37[1].length;
                        pdVar37->pos = pdVar37[1].pos;
                        pdVar37->length = UVar6;
                        pdVar37 = pdVar37 + 1;
                      }
                      table->pos = table->pos - 1;
                    }
                  }
                }
                uVar38 = (ulong)(iVar11 + uVar29);
                if ((1 < uVar10) && (cVar22 = clock(), 300000 < cVar22 - local_388)) {
                  local_388 = clock();
                  uVar38 = (ulong)(iVar11 + uVar29);
                  fprintf(_stderr,"\r%4.2f %% \r",
                          SUB84(((double)uVar38 / (double)(long)sVar36) * 100.0,0));
                  fflush(_stderr);
                  if (3 < uVar10) {
                    fflush(_stderr);
                  }
                }
              }
            }
            else {
              uVar38 = (ulong)(iVar11 + 1);
            }
          }
        }
      }
      local_3e0 = 1;
      free(__ptr);
      free(pvVar18);
      free(__s);
      if (2 < uVar10) {
        uVar23 = table->pos;
        uVar26 = 0x19;
        if (uVar23 < 0x19) {
          uVar26 = (ulong)uVar23;
        }
        UVar12 = ZDICT_dictSize(table);
        fprintf(_stderr,"\n %u segments found, of total size %u \n",(ulong)(uVar23 - 1),
                (ulong)UVar12);
        fflush(_stderr);
        fprintf(_stderr,"list %u best segments \n",(ulong)((int)uVar26 - 1));
        fflush(_stderr);
        for (uVar38 = 1; uVar38 < uVar26; uVar38 = uVar38 + 1) {
          uVar20 = (ulong)table[uVar38].pos;
          uVar23 = table[uVar38].length;
          if (sVar17 < table[uVar38].pos + uVar23 || sVar17 < uVar20) goto LAB_001b26e2;
          uVar33 = 0x28;
          if (uVar23 < 0x28) {
            uVar33 = (ulong)uVar23;
          }
          fprintf(_stderr,"%3u:%3u bytes at pos %8u, savings %7u bytes |",uVar38 & 0xffffffff,
                  (ulong)uVar23,uVar20,(ulong)table[uVar38].savings);
          fflush(_stderr);
          for (uVar34 = 0; uVar33 != uVar34; uVar34 = uVar34 + 1) {
            bVar8 = T[uVar34 + uVar20];
            if ((byte)(bVar8 + 0x81) < 0xa1) {
              bVar8 = 0x2e;
            }
            fputc((uint)bVar8,_stderr);
            fflush(_stderr);
          }
          fwrite("| \n",3,1,_stderr);
          fflush(_stderr);
        }
      }
      UVar12 = ZDICT_dictSize(table);
      if (0x7f < UVar12) {
        if ((1 < uVar10) && ((ulong)UVar12 < dictBufferCapacity >> 2)) {
          fprintf(_stderr,
                  "!  warning : selected content significantly smaller than requested (%u < %u) \n",
                  (ulong)UVar12,dictBufferCapacity & 0xffffffff);
          fflush(_stderr);
          if (sVar17 < dictBufferCapacity * 10) {
            fprintf(_stderr,"!  consider increasing the number of samples (total size : %u MB)\n",
                    sVar17 >> 0x14);
            fflush(_stderr);
          }
          if (4 < uVar28) {
            fprintf(_stderr,
                    "!  consider increasing selectivity to produce larger dictionary (-s%u) \n",
                    (ulong)(uVar9 + 1));
            fflush(_stderr);
            fwrite("!  note : larger dictionaries are not necessarily better, test its efficiency on samples \n"
                   ,0x5a,1,_stderr);
            fflush(_stderr);
          }
        }
        if ((1 < uVar9 && 8 < nbSamples) && dictBufferCapacity * 3 < (ulong)UVar12) {
          do {
            uVar9 = uVar9 - 1;
          } while (nbSamples >> ((byte)uVar9 & 0x1f) < 5);
          if (1 < uVar10) {
            fprintf(_stderr,
                    "!  note : calculated dictionary significantly larger than requested (%u > %u) \n"
                    ,(ulong)UVar12,dictBufferCapacity);
            fflush(_stderr);
            fprintf(_stderr,
                    "!  consider increasing dictionary size, or produce denser dictionary (-s%u) \n"
                    ,(ulong)uVar9);
            fflush(_stderr);
            fwrite("!  always test dictionary efficiency on real samples \n",0x36,1,_stderr);
            fflush(_stderr);
          }
        }
        uVar9 = table->pos;
        if (1 < uVar9) {
          local_3e0 = uVar9;
        }
        pUVar27 = &table[1].length;
        sVar17 = 0;
        for (uVar26 = 1; uVar26 < uVar9; uVar26 = uVar26 + 1) {
          uVar38 = (ulong)(*pUVar27 + (int)sVar17);
          if (dictBufferCapacity < uVar38) {
            local_3e0 = (uint)uVar26;
            break;
          }
          pUVar27 = pUVar27 + 3;
          sVar17 = uVar38;
        }
        pvVar18 = (void *)((long)dictBuffer + dictBufferCapacity);
        for (lVar25 = 0xc; (ulong)local_3e0 * 0xc - lVar25 != 0; lVar25 = lVar25 + 0xc) {
          uVar26 = (ulong)*(uint *)((long)&table->length + lVar25);
          pvVar18 = (void *)((long)pvVar18 - uVar26);
          if (pvVar18 < dictBuffer) goto LAB_001b26e2;
          memcpy(pvVar18,T + *(uint *)((long)&table->pos + lVar25),uVar26);
        }
        local_338[0].compressionLevel = params.zParams.compressionLevel;
        local_338[0].notificationLevel = params.zParams.notificationLevel;
        local_338[0].dictID = params.zParams.dictID;
        sVar17 = ZDICT_addEntropyTablesFromBuffer_advanced
                           (dictBuffer,sVar17,dictBufferCapacity,T,samplesSizes,nbSamples,
                            ZVar7.zParams);
        free(table);
        goto LAB_001b256c;
      }
    }
    free(table);
    uVar40 = 0xffffffde;
  }
LAB_001b256a:
  sVar17 = CONCAT44(0xffffffff,uVar40);
LAB_001b256c:
  free(T);
  return sVar17;
LAB_001b26e2:
  free(table);
  uVar40 = 0xffffffff;
  goto LAB_001b256a;
}

Assistant:

size_t ZDICT_trainFromBuffer_legacy(void* dictBuffer, size_t dictBufferCapacity,
                              const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
                              ZDICT_legacy_params_t params)
{
    size_t result;
    void* newBuff;
    size_t const sBuffSize = ZDICT_totalSampleSize(samplesSizes, nbSamples);
    if (sBuffSize < ZDICT_MIN_SAMPLES_SIZE) return 0;   /* not enough content => no dictionary */

    newBuff = malloc(sBuffSize + NOISELENGTH);
    if (!newBuff) return ERROR(memory_allocation);

    memcpy(newBuff, samplesBuffer, sBuffSize);
    ZDICT_fillNoise((char*)newBuff + sBuffSize, NOISELENGTH);   /* guard band, for end of buffer condition */

    result =
        ZDICT_trainFromBuffer_unsafe_legacy(dictBuffer, dictBufferCapacity, newBuff,
                                            samplesSizes, nbSamples, params);
    free(newBuff);
    return result;
}